

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int open_set_outgoing_locales(OPEN_HANDLE open,AMQP_VALUE outgoing_locales_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar2 = 0x66f;
  }
  else {
    iVar2 = 0x67f;
    if (outgoing_locales_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(outgoing_locales_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(open->composite_value,5,item_value);
        iVar2 = 0x685;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int open_set_outgoing_locales(OPEN_HANDLE open, AMQP_VALUE outgoing_locales_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE outgoing_locales_amqp_value;
        if (outgoing_locales_value == NULL)
        {
            outgoing_locales_amqp_value = NULL;
        }
        else
        {
            outgoing_locales_amqp_value = amqpvalue_clone(outgoing_locales_value);
        }
        if (outgoing_locales_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 5, outgoing_locales_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(outgoing_locales_amqp_value);
        }
    }

    return result;
}